

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O3

IVal * __thiscall
vkt::shaderexecutor::
Apply<vkt::shaderexecutor::Signature<tcu::Matrix<float,_4,_2>,_tcu::Vector<float,_4>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
::doEvaluate(IVal *__return_storage_ptr__,
            Apply<vkt::shaderexecutor::Signature<tcu::Matrix<float,_4,_2>,_tcu::Vector<float,_4>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
            *this,EvalContext *ctx)

{
  ApplyFunc *pAVar1;
  Expr<tcu::Vector<float,_2>_> *pEVar2;
  Expr<vkt::shaderexecutor::Void> *pEVar3;
  undefined1 local_e2;
  undefined1 local_e1;
  undefined1 *local_e0;
  undefined1 *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  undefined1 local_c0 [48];
  undefined1 local_90 [96];
  
  pAVar1 = this->m_func;
  (*(((this->m_args).a.super_ContainerExprPBase<tcu::Vector<float,_4>_>.
      super_ExprPBase<tcu::Vector<float,_4>_>.
      super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Vector<float,_4>_>_>.m_ptr)->
    super_ExprBase)._vptr_ExprBase[4])(local_90);
  pEVar2 = (this->m_args).b.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
           super_ExprPBase<tcu::Vector<float,_2>_>.
           super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Vector<float,_2>_>_>.m_ptr;
  (*(pEVar2->super_ExprBase)._vptr_ExprBase[4])(local_c0,pEVar2,ctx);
  pEVar3 = (this->m_args).c.super_ContainerExprPBase<vkt::shaderexecutor::Void>.
           super_ExprPBase<vkt::shaderexecutor::Void>.
           super_SharedPtr<const_vkt::shaderexecutor::Expr<vkt::shaderexecutor::Void>_>.m_ptr;
  (*(pEVar3->super_ExprBase)._vptr_ExprBase[4])(pEVar3,ctx);
  pEVar3 = (this->m_args).d.super_ContainerExprPBase<vkt::shaderexecutor::Void>.
           super_ExprPBase<vkt::shaderexecutor::Void>.
           super_SharedPtr<const_vkt::shaderexecutor::Expr<vkt::shaderexecutor::Void>_>.m_ptr;
  (*(pEVar3->super_ExprBase)._vptr_ExprBase[4])(pEVar3,ctx);
  local_d0 = &local_e1;
  local_c8 = &local_e2;
  local_e0 = local_90;
  local_d8 = local_c0;
  (**(code **)(*(long *)pAVar1 + 0x40))(__return_storage_ptr__,pAVar1,ctx);
  return __return_storage_ptr__;
}

Assistant:

IVal				doEvaluate		(const EvalContext& ctx) const
	{
		return m_func.apply(ctx,
							m_args.a->evaluate(ctx), m_args.b->evaluate(ctx),
							m_args.c->evaluate(ctx), m_args.d->evaluate(ctx));
	}